

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckArrayClose<int[4],(anonymous_namespace)::ThrowingObject,float>
               (TestResults *results,int (*expected) [4],ThrowingObject *actual,int count,
               float *tolerance,TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  float fVar2;
  int local_1ec;
  int local_1e8;
  int actualIndex;
  int expectedIndex;
  undefined1 local_1d8 [8];
  MemoryOutStream stream;
  bool equal;
  TestDetails *details_local;
  float *tolerance_local;
  int count_local;
  ThrowingObject *actual_local;
  int (*expected_local) [4];
  TestResults *results_local;
  
  stream._407_1_ =
       ArrayAreClose<int[4],(anonymous_namespace)::ThrowingObject,float>
                 (expected,actual,count,tolerance);
  if (!(bool)stream._407_1_) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1d8);
    std::operator<<((ostream *)local_1d8,"Expected [ ");
    for (local_1e8 = 0; local_1e8 < count; local_1e8 = local_1e8 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(local_1d8,(*expected)[local_1e8]);
      std::operator<<(poVar1," ");
    }
    poVar1 = std::operator<<((ostream *)local_1d8,"] +/- ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*tolerance);
    std::operator<<(poVar1," but was [ ");
    for (local_1ec = 0; local_1ec < count; local_1ec = local_1ec + 1) {
      fVar2 = anon_unknown.dwarf_3cf1::ThrowingObject::operator[](actual,local_1ec);
      poVar1 = (ostream *)std::ostream::operator<<(local_1d8,fVar2);
      std::operator<<(poVar1," ");
    }
    std::operator<<((ostream *)local_1d8,"]");
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1d8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1d8);
  }
  return;
}

Assistant:

void CheckArrayClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const count, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = ArrayAreClose(expected, actual, count, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";
        for (int expectedIndex = 0; expectedIndex < count; ++expectedIndex)
            stream << expected[expectedIndex] << " ";
        stream << "] +/- " << tolerance << " but was [ ";

		for (int actualIndex = 0; actualIndex < count; ++actualIndex)
            stream << actual[actualIndex] << " ";
        stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}